

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void greatest_run_suite(greatest_suite_cb *suite_cb,char *suite_name)

{
  int iVar1;
  char *pcVar2;
  
  if ((greatest_info.suite_filter != (char *)0x0) &&
     (iVar1 = greatest_name_match(suite_name,greatest_info.suite_filter), iVar1 == 0)) {
    return;
  }
  update_counts_and_reset_suite();
  if (((greatest_info.flags & 1) != 0) && (greatest_info.failed != 0)) {
    return;
  }
  fprintf(_stdout,"\n* Suite %s:\n",suite_name);
  greatest_info.suite.pre_suite = clock();
  if (greatest_info.suite.pre_suite == -1) {
    pcVar2 = "greatest_info.suite.pre_suite";
  }
  else {
    (*suite_cb)();
    greatest_info.suite.post_suite = clock();
    if (greatest_info.suite.post_suite != -1) {
      if (greatest_info.suite.tests_run == 0) {
        return;
      }
      pcVar2 = "s";
      if (greatest_info.suite.tests_run == 1) {
        pcVar2 = "";
      }
      fprintf(_stdout,"\n%u test%s - %u passed, %u failed, %u skipped",
              (ulong)greatest_info.suite.tests_run,pcVar2,(ulong)greatest_info.suite.passed,
              (ulong)greatest_info.suite.failed,greatest_info.suite.skipped);
      fprintf(_stdout," (%lu ticks, %.3f sec)",
              (double)(greatest_info.suite.post_suite - greatest_info.suite.pre_suite) / 1000000.0);
      fputc(10,_stdout);
      return;
    }
    pcVar2 = "greatest_info.suite.post_suite";
    greatest_info.suite.post_suite = -1;
  }
  fprintf(_stdout,"clock error: %s\n",pcVar2);
  exit(1);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}